

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_ModifySubscription
               (UA_Server *server,UA_Session *session,UA_ModifySubscriptionRequest *request,
               UA_ModifySubscriptionResponse *response)

{
  UA_Subscription *subscription;
  uint local_70;
  uint local_68;
  uint local_64;
  UA_Subscription *sub;
  UA_ModifySubscriptionResponse *response_local;
  UA_ModifySubscriptionRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_68 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_64 = 0;
    }
    else {
      local_64 = session->channel->connection->sockfd;
    }
    local_68 = local_64;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_70 = 0;
  }
  else {
    local_70 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing ModifySubscriptionRequest"
               ,(ulong)local_68,(ulong)local_70,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  subscription = UA_Session_getSubscriptionByID(session,request->subscriptionId);
  if (subscription == (UA_Subscription *)0x0) {
    (response->responseHeader).serviceResult = 0x80280000;
  }
  else {
    setSubscriptionSettings
              (server,subscription,request->requestedPublishingInterval,
               request->requestedLifetimeCount,request->requestedMaxKeepAliveCount,
               request->maxNotificationsPerPublish,request->priority);
    subscription->currentLifetimeCount = 0;
    response->revisedPublishingInterval = subscription->publishingInterval;
    response->revisedLifetimeCount = subscription->lifeTimeCount;
    response->revisedMaxKeepAliveCount = subscription->maxKeepAliveCount;
  }
  return;
}

Assistant:

void
Service_ModifySubscription(UA_Server *server, UA_Session *session,
                           const UA_ModifySubscriptionRequest *request,
                           UA_ModifySubscriptionResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing ModifySubscriptionRequest");
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    setSubscriptionSettings(server, sub, request->requestedPublishingInterval,
                            request->requestedLifetimeCount, request->requestedMaxKeepAliveCount,
                            request->maxNotificationsPerPublish, request->priority);
    sub->currentLifetimeCount = 0; /* Reset the subscription lifetime */
    response->revisedPublishingInterval = sub->publishingInterval;
    response->revisedLifetimeCount = sub->lifeTimeCount;
    response->revisedMaxKeepAliveCount = sub->maxKeepAliveCount;
}